

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_14::NameApplier::OnMemoryInitExpr(NameApplier *this,MemoryInitExpr *expr)

{
  bool bVar1;
  Result RVar2;
  MemoryInitExpr *expr_local;
  NameApplier *this_local;
  
  RVar2 = UseNameForDataSegmentVar(this,&expr->var);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    RVar2 = UseNameForMemoryVar(this,&(expr->super_MemoryExpr<(wabt::ExprType)32>).memidx);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result NameApplier::OnMemoryInitExpr(MemoryInitExpr* expr) {
  CHECK_RESULT(UseNameForDataSegmentVar(&expr->var));
  CHECK_RESULT(UseNameForMemoryVar(&expr->memidx));
  return Result::Ok;
}